

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scaling.cpp
# Opt level: O0

void scale(Runtime *rt)

{
  Instance *in_RDI;
  Runtime *in_stack_000000e0;
  Runtime *in_stack_00000150;
  
  Instance::operator=(&rt->instance,in_RDI);
  scale_rows(in_stack_000000e0);
  scale_cols(in_stack_00000150);
  scale_rows(in_stack_000000e0);
  return;
}

Assistant:

void scale(Runtime& rt) {
  rt.scaled = rt.instance;
  scale_rows(rt);
  scale_cols(rt);
  scale_rows(rt);
}